

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

group * clipp::operator_(group *__return_storage_ptr__,group *a,group *b)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  __type_conflict _Var4;
  ulong uVar5;
  doc_string *__lhs;
  doc_string *__rhs;
  group *local_148;
  group local_100;
  byte local_b1;
  group local_b0;
  group local_68;
  group *local_20;
  group *b_local;
  group *a_local;
  
  local_20 = b;
  b_local = a;
  a_local = __return_storage_ptr__;
  bVar3 = group::scoped(a);
  local_b1 = 0;
  bVar2 = false;
  bVar1 = false;
  if ((((bVar3) || (bVar3 = group::blocking(a), bVar3)) || (bVar3 = group::exclusive(a), bVar3)) ||
     ((bVar3 = detail::token<clipp::group>::repeatable(&a->super_token<clipp::group>), bVar3 ||
      (bVar3 = group::joinable(a), bVar3)))) {
LAB_00106ea5:
    group::group(&local_b0,a);
    local_b1 = 1;
    group::group(&local_100,b);
    bVar2 = true;
    group::group<clipp::group>(&local_68,&local_b0,&local_100);
    bVar1 = true;
    local_148 = group::scoped(&local_68,false);
  }
  else {
    detail::token<clipp::group>::doc_abi_cxx11_(&a->super_token<clipp::group>);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      __lhs = detail::token<clipp::group>::doc_abi_cxx11_(&a->super_token<clipp::group>);
      __rhs = detail::token<clipp::group>::doc_abi_cxx11_(&b->super_token<clipp::group>);
      _Var4 = std::operator==(__lhs,__rhs);
      if (!_Var4) goto LAB_00106ea5;
    }
    local_148 = group::push_back(a,b);
  }
  group::group(__return_storage_ptr__,local_148);
  if (bVar1) {
    group::~group(&local_68);
  }
  if (bVar2) {
    group::~group(&local_100);
  }
  if ((local_b1 & 1) != 0) {
    group::~group(&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline group
operator , (group a, group b)
{
    return !a.scoped() && !a.blocking() && !a.exclusive() && !a.repeatable()
        && !a.joinable() && (a.doc().empty() || a.doc() == b.doc())
       ? a.push_back(std::move(b))
       : group{std::move(a), std::move(b)}.scoped(false);
}